

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

size_t av1_write_metadata_obu(aom_metadata_t *metadata,uint8_t *dst,size_t dst_size)

{
  int iVar1;
  size_t *in_RDX;
  uint8_t *in_RSI;
  size_t in_RDI;
  uint64_t metadata_type;
  size_t coded_metadata_size;
  uint64_t in_stack_fffffffffffffff8;
  size_t sVar2;
  
  iVar1 = aom_uleb_encode(in_stack_fffffffffffffff8,in_RDI,in_RSI,in_RDX);
  if (iVar1 == 0) {
    if (in_RDX < (size_t *)(*(long *)(in_RDI + 0x10) + 1U)) {
      sVar2 = 0;
    }
    else {
      memcpy(in_RSI,*(void **)(in_RDI + 8),*(size_t *)(in_RDI + 0x10));
      in_RSI[*(long *)(in_RDI + 0x10)] = 0x80;
      sVar2 = *(long *)(in_RDI + 0x10) + 1;
    }
  }
  else {
    sVar2 = 0;
  }
  return sVar2;
}

Assistant:

static size_t av1_write_metadata_obu(const aom_metadata_t *metadata,
                                     uint8_t *const dst, size_t dst_size) {
  size_t coded_metadata_size = 0;
  const uint64_t metadata_type = (uint64_t)metadata->type;
  if (aom_uleb_encode(metadata_type, dst_size, dst, &coded_metadata_size) !=
      0) {
    return 0;
  }
  if (coded_metadata_size + metadata->sz + 1 > dst_size) {
    return 0;
  }
  memcpy(dst + coded_metadata_size, metadata->payload, metadata->sz);
  // Add trailing bits.
  dst[coded_metadata_size + metadata->sz] = 0x80;
  return coded_metadata_size + metadata->sz + 1;
}